

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utest.cpp
# Opt level: O2

void __thiscall
UtestShellPointerArray::UtestShellPointerArray(UtestShellPointerArray *this,UtestShell *firstTest)

{
  int iVar1;
  uint extraout_var;
  UtestShell **ppUVar3;
  undefined4 extraout_var_00;
  size_t i;
  ulong uVar4;
  size_t sVar2;
  
  this->arrayOfTests_ = (UtestShell **)0x0;
  this->count_ = 0;
  if (firstTest != (UtestShell *)0x0) {
    iVar1 = (*firstTest->_vptr_UtestShell[4])(firstTest);
    sVar2 = CONCAT44(extraout_var,iVar1);
    this->count_ = sVar2;
    if (sVar2 != 0) {
      ppUVar3 = (UtestShell **)
                operator_new__(-(ulong)(extraout_var >> 0x1d != 0) | sVar2 << 3,
                               "/workspace/llm4binary/github/license_c_cmakelists/bneumann[P]CppUTest-Test-Adapter/build_O2/_deps/cpputest-src/src/CppUTest/Utest.cpp"
                               ,0x337);
      this->arrayOfTests_ = ppUVar3;
      for (uVar4 = 0; uVar4 < this->count_; uVar4 = uVar4 + 1) {
        this->arrayOfTests_[uVar4] = firstTest;
        iVar1 = (*firstTest->_vptr_UtestShell[3])(firstTest);
        firstTest = (UtestShell *)CONCAT44(extraout_var_00,iVar1);
      }
    }
  }
  return;
}

Assistant:

UtestShellPointerArray::UtestShellPointerArray(UtestShell* firstTest)
    : arrayOfTests_(NULLPTR), count_(0)
{
    count_ = (firstTest) ? firstTest->countTests() : 0;
    if (count_ == 0) return;

    arrayOfTests_ = new UtestShell*[count_];

    UtestShell*currentTest = firstTest;
    for (size_t i = 0; i < count_; i++)
    {
        arrayOfTests_[i] = currentTest;
        currentTest = currentTest->getNext();
    }
}